

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O1

void helics::valueExtract
               (data_view *data,DataType baseType,vector<double,_std::allocator<double>_> *val)

{
  string_view val_00;
  uint *puVar1;
  data_view *data_00;
  vector<double,_std::allocator<double>_> *__args;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *__range3;
  iterator iVar2;
  ulong uVar3;
  _Uninitialized<double,_true> _Var4;
  undefined4 uVar5;
  undefined4 uVar6;
  string_view val_01;
  double val_1;
  undefined1 local_78 [32];
  double local_58 [3];
  vector<double,_std::allocator<double>_> local_40;
  helics *local_28;
  
  __args = (vector<double,_std::allocator<double>_> *)local_78;
  std::vector<double,_std::allocator<double>_>::resize(val,0);
  puVar1 = &switchD_0021bafb::switchdataD_003e840c;
  switch(baseType) {
  case HELICS_DOUBLE:
    detail::convertFromBinary((byte *)(data->dblock)._M_str,(double *)local_78);
    _Var4._M_storage = (double)local_78._0_8_;
    break;
  case HELICS_INT:
    detail::convertFromBinary((byte *)(data->dblock)._M_str,(int64_t *)local_78);
    _Var4._M_storage = (double)(double)(long)local_78._0_8_;
    break;
  case HELICS_COMPLEX:
    local_78._0_8_ = 0.0;
    local_78._8_8_ = (helics *)0x0;
    detail::convertFromBinary((byte *)(data->dblock)._M_str,(complex<double> *)local_78);
    iVar2._M_current =
         (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar2._M_current ==
        (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      local_28 = (helics *)local_78._8_8_;
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (val,iVar2,(double *)local_78);
      local_78._0_8_ = local_28;
    }
    else {
      *iVar2._M_current = (double)local_78._0_8_;
      (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish = iVar2._M_current + 1;
      local_78._0_8_ = local_78._8_8_;
    }
    if (((double)local_78._0_8_ == 0.0) && (!NAN((double)local_78._0_8_))) {
      return;
    }
    iVar2._M_current =
         (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    __args = (vector<double,_std::allocator<double>_> *)local_78;
    if (iVar2._M_current ==
        (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) goto LAB_0021bda7;
    *iVar2._M_current = (double)local_78._0_8_;
    goto LAB_0021bc5e;
  case HELICS_VECTOR:
    detail::convertFromBinary((byte *)(data->dblock)._M_str,val);
    return;
  case HELICS_COMPLEX_VECTOR:
    ValueConverter<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>::
    interpret((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_78,data)
    ;
    std::vector<double,_std::allocator<double>_>::reserve
              (val,(long)(local_78._8_8_ - local_78._0_8_) >> 4);
    if (local_78._0_8_ != local_78._8_8_) {
      _Var4._M_storage = (double)local_78._0_8_;
      do {
        if ((*(double *)((long)_Var4._M_storage + 8) != 0.0) ||
           (NAN(*(double *)((long)_Var4._M_storage + 8)))) {
          local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)cabs(*_Var4._M_storage);
          uVar5 = SUB84(local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,0);
          uVar6 = (undefined4)
                  ((ulong)local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start >> 0x20);
          iVar2._M_current =
               (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar2._M_current !=
              (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) goto LAB_0021bcf1;
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (val,iVar2,(double *)&local_40);
        }
        else {
          local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = *(pointer *)_Var4._M_storage;
          uVar5 = SUB84(local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,0);
          uVar6 = (undefined4)
                  ((ulong)local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start >> 0x20);
          iVar2._M_current =
               (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      (val,iVar2,(double *)&local_40);
          }
          else {
LAB_0021bcf1:
            *iVar2._M_current = (double)CONCAT44(uVar6,uVar5);
            (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar2._M_current + 1;
          }
        }
        _Var4._M_storage = _Var4._M_storage + 0x10;
      } while (_Var4._M_storage != (double)local_78._8_8_);
    }
    if ((double)local_78._0_8_ == 0.0) {
      return;
    }
    uVar3 = local_78._16_8_ - local_78._0_8_;
    goto LAB_0021bdd4;
  case HELICS_NAMED_POINT:
    ValueConverter<helics::NamedPoint>::interpret((NamedPoint *)local_78,data);
    if (NAN(local_58[0])) {
      val_01._M_str = (char *)puVar1;
      val_01._M_len = local_78._0_8_;
      helicsGetVector(&local_40,(helics *)local_78._8_8_,val_01);
      std::vector<double,_std::allocator<double>_>::_M_move_assign(val,&local_40);
      if ((helics *)
          local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (helics *)0x0) {
        operator_delete(local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    else {
      iVar2._M_current =
           (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
          ._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)val,iVar2,local_58);
      }
      else {
        *iVar2._M_current = local_58[0];
        (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
        _M_finish = iVar2._M_current + 1;
      }
    }
    if (local_78._0_8_ == (long)local_78 + 0x10) {
      return;
    }
    uVar3 = local_78._16_8_ + 1;
LAB_0021bdd4:
    operator_delete((void *)local_78._0_8_,uVar3);
    return;
  case HELICS_BOOL:
    goto switchD_0021bafb_caseD_7;
  case HELICS_TIME:
    detail::convertFromBinary((byte *)(data->dblock)._M_str,(int64_t *)local_78);
    _Var4._M_storage =
         (double)((long)local_78._0_8_ % 1000000000) * 1e-09 +
         (double)((long)local_78._0_8_ / 1000000000);
    iVar2._M_current =
         (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    local_78._0_8_ = _Var4._M_storage;
    if (iVar2._M_current ==
        (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) goto LAB_0021bda7;
    goto LAB_0021bc5a;
  default:
    if (baseType == HELICS_JSON) {
      readJsonValue_abi_cxx11_((defV *)local_78,(helics *)data,data_00);
      valueExtract((defV *)local_78,val);
      std::__detail::__variant::
      _Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
      ::~_Variant_storage((_Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                           *)local_78);
      return;
    }
    goto switchD_0021bafb_caseD_7;
  }
  iVar2._M_current =
       (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar2._M_current ==
      (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    __args = &local_40;
    local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)_Var4._M_storage;
LAB_0021bda7:
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (val,iVar2,(double *)__args);
  }
  else {
LAB_0021bc5a:
    *iVar2._M_current = _Var4._M_storage;
LAB_0021bc5e:
    (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current + 1;
  }
  return;
switchD_0021bafb_caseD_7:
  local_78._0_8_ = 0.0;
  local_78._8_8_ = (char *)0x0;
  detail::convertFromBinary((byte *)(data->dblock)._M_str,(string_view *)local_78);
  val_00._M_str = (char *)local_78._8_8_;
  val_00._M_len = local_78._0_8_;
  helicsGetVector(val_00,val);
  return;
}

Assistant:

void valueExtract(const data_view& data, DataType baseType, std::vector<double>& val)
{
    val.resize(0);
    switch (baseType) {
        case DataType::HELICS_DOUBLE: {
            val.push_back(ValueConverter<double>::interpret(data));
            break;
        }
        case DataType::HELICS_INT: {
            val.push_back(static_cast<double>(ValueConverter<int64_t>::interpret(data)));
            break;
        }
        case DataType::HELICS_TIME: {
            const Time time(ValueConverter<int64_t>::interpret(data), time_units::ns);
            val.push_back(static_cast<double>(time));
        } break;
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR:
        default: {
            helicsGetVector(ValueConverter<std::string_view>::interpret(data), val);
            break;
        }
        case DataType::HELICS_NAMED_POINT: {
            auto npval = ValueConverter<NamedPoint>::interpret(data);
            if (std::isnan(npval.value)) {
                val = helicsGetVector(npval.name);
            } else {
                val.push_back(npval.value);
            }
            break;
        }
        case DataType::HELICS_VECTOR: {
            ValueConverter<std::vector<double>>::interpret(data, val);
            break;
        }
        case DataType::HELICS_COMPLEX: {
            auto cval = ValueConverter<std::complex<double>>::interpret(data);
            val.push_back(cval.real());
            if (cval.imag() != 0.0) {
                val.push_back(cval.imag());
            }
            break;
        }
        case DataType::HELICS_COMPLEX_VECTOR: {
            auto cvec = ValueConverter<std::vector<std::complex<double>>>::interpret(data);
            val.reserve(cvec.size());
            for (auto& cval : cvec) {
                if (cval.imag() == 0.0) {
                    val.push_back(cval.real());
                } else {
                    val.push_back(std::abs(cval));
                }
            }
            break;
        }
        case DataType::HELICS_JSON:
            valueExtract(readJsonValue(data), val);
            break;
    }
}